

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall Shop::printMedicines(Shop *this)

{
  ostream *poVar1;
  ulong uVar2;
  long lVar3;
  pointer pMVar4;
  ulong uVar5;
  Medicine medicine;
  Medicine local_c0;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ID",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Name",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Company Name",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Unit Price",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"In Stock",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Quantity",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Arrival Date",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Expire Date",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  pMVar4 = (this->medicineList).super__Vector_base<Medicine,_std::allocator<Medicine>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->medicineList).super__Vector_base<Medicine,_std::allocator<Medicine>_>._M_impl.
      super__Vector_impl_data._M_finish != pMVar4) {
    lVar3 = 0;
    uVar5 = 0;
    do {
      Medicine::Medicine(&local_c0,(Medicine *)((long)&pMVar4->id + lVar3));
      uVar5 = uVar5 + 1;
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,local_c0.name._M_dataplus._M_p,local_c0.name._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,local_c0.companyName._M_dataplus._M_p,
                          local_c0.companyName._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t    ",5);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c0.unitePrice);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t\t   ",5);
      poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t\t  ",4);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c0.quantity);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t\t  ",4);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,local_c0.arrivalDate._M_dataplus._M_p,
                          local_c0.arrivalDate._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,local_c0.expireDate._M_dataplus._M_p,
                          local_c0.expireDate._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.expireDate._M_dataplus._M_p != &local_c0.expireDate.field_2) {
        operator_delete(local_c0.expireDate._M_dataplus._M_p,
                        local_c0.expireDate.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.arrivalDate._M_dataplus._M_p != &local_c0.arrivalDate.field_2) {
        operator_delete(local_c0.arrivalDate._M_dataplus._M_p,
                        local_c0.arrivalDate.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.companyName._M_dataplus._M_p != &local_c0.companyName.field_2) {
        operator_delete(local_c0.companyName._M_dataplus._M_p,
                        local_c0.companyName.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.name._M_dataplus._M_p != &local_c0.name.field_2) {
        operator_delete(local_c0.name._M_dataplus._M_p,
                        local_c0.name.field_2._M_allocated_capacity + 1);
      }
      pMVar4 = (this->medicineList).super__Vector_base<Medicine,_std::allocator<Medicine>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = ((long)(this->medicineList).super__Vector_base<Medicine,_std::allocator<Medicine>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4 >> 4) *
              -0x71c71c71c71c71c7;
      lVar3 = lVar3 + 0x90;
    } while (uVar5 <= uVar2 && uVar2 - uVar5 != 0);
  }
  return;
}

Assistant:

void printMedicines() {
        cout << "ID" << "\t" << "Name" << "\t\t" << "Company Name" << "\t" << "Unit Price" << "\t" << "In Stock" << "\t"
             << "Quantity" << "\t" << "Arrival Date" << "\t" << "Expire Date" << endl;
        for (int i = 0; i < medicineList.size(); i++) {
            Medicine medicine = medicineList[i];
            cout << i + 1 << "\t" << medicine.getName() << "\t" << medicine.getCompanyName() << "\t    "
                 << medicine.getUnitePrice() << "\t\t   " << medicine.getIsStock() << "\t\t  " << medicine.getQuantity()
                 << "\t\t  " << medicine.getArrivalDate() << "\t" << medicine.getExpireDate() << endl;
        }
    }